

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O0

void __thiscall
LTOnlineChannel::LTOnlineChannel(LTOnlineChannel *this,dataRefsLT ch,LTChannelType t,char *chName)

{
  void *pvVar1;
  undefined4 in_EDX;
  undefined4 in_ESI;
  long *in_RDI;
  LTChannel *unaff_retaddr;
  
  LTChannel::LTChannel
            (unaff_retaddr,(dataRefsLT)((ulong)in_RDI >> 0x20),(LTChannelType)in_RDI,
             (char *)CONCAT44(in_ESI,in_EDX));
  *in_RDI = (long)&PTR__LTOnlineChannel_0046cb58;
  in_RDI[0x13] = 0;
  std::__cxx11::string::string((string *)(in_RDI + 0x14));
  pvVar1 = malloc(0x4000);
  in_RDI[0x18] = (long)pvVar1;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0x4000;
  in_RDI[0x39] = 0;
  in_RDI[0x3a] = 0;
  in_RDI[0x37] = 0;
  in_RDI[0x38] = 0;
  in_RDI[0x35] = 0;
  in_RDI[0x36] = 0;
  in_RDI[0x33] = 0;
  in_RDI[0x34] = 0;
  in_RDI[0x31] = 0;
  in_RDI[0x32] = 0;
  in_RDI[0x2f] = 0;
  in_RDI[0x30] = 0;
  in_RDI[0x2d] = 0;
  in_RDI[0x2e] = 0;
  in_RDI[0x2b] = 0;
  in_RDI[0x2c] = 0;
  in_RDI[0x29] = 0;
  in_RDI[0x2a] = 0;
  in_RDI[0x27] = 0;
  in_RDI[0x28] = 0;
  in_RDI[0x25] = 0;
  in_RDI[0x26] = 0;
  in_RDI[0x23] = 0;
  in_RDI[0x24] = 0;
  in_RDI[0x21] = 0;
  in_RDI[0x22] = 0;
  in_RDI[0x1f] = 0;
  in_RDI[0x20] = 0;
  in_RDI[0x1d] = 0;
  in_RDI[0x1e] = 0;
  in_RDI[0x1b] = 0;
  in_RDI[0x1c] = 0;
  in_RDI[0x3b] = 200;
  (**(code **)(*in_RDI + 0x90))();
  return;
}

Assistant:

LTOnlineChannel::LTOnlineChannel (dataRefsLT ch, LTChannelType t, const char* chName) :
LTChannel(ch, t, chName),
pCurl(NULL),
netData((char*)malloc(CURL_MAX_WRITE_SIZE)),      // initial buffer allocation
netDataPos(0), netDataSize(CURL_MAX_WRITE_SIZE),
curl_errtxt{0}, httpResponse(HTTP_OK)
{
    // initialize a CURL handle (sets invalid if it fails)
    InitCurl();
}